

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

string * __thiscall
Assimp::B3DImporter::ReadString_abi_cxx11_(string *__return_storage_ptr__,B3DImporter *this)

{
  int iVar1;
  B3DImporter *this_00;
  string str;
  allocator<char> local_61;
  _Alloc_hider local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  
  local_58 = 0;
  local_50 = '\0';
  local_60._M_p = &local_50;
  while( true ) {
    if ((ulong)((long)(this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <= (ulong)this->_pos) {
      this_00 = (B3DImporter *)&stack0xffffffffffffffc0;
      std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"EOF",&local_61);
      Fail(this_00,(string *)&stack0xffffffffffffffc0);
    }
    iVar1 = ReadByte(this);
    if (iVar1 == 0) break;
    std::__cxx11::string::push_back((char)&local_60);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_60._M_p == &local_50) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_48;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  __return_storage_ptr__->_M_string_length = local_58;
  local_58 = 0;
  local_50 = '\0';
  local_60._M_p = &local_50;
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

aiVector3D B3DImporter::ReadVec3(){
    float x=ReadFloat();
    float y=ReadFloat();
    float z=ReadFloat();
    return aiVector3D( x,y,z );
}